

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptSamplerTypeDX9(HlslGrammar *this,TType *type)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  int iVar3;
  undefined4 extraout_var;
  TSampler sampler;
  TType txType;
  TType local_c0;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar1 = false;
  TType::TType(&txType,EbtFloat,EvqUniform,4,0,0,false);
  if (EVar2 - EHTokSampler < 5) {
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    sampler = (TSampler)
              ((uint)(byte)txType._8_1_ |
              *(uint *)(&DAT_00734450 + (ulong)(EVar2 - EHTokSampler) * 4));
    bVar1 = HlslParseContext::setTextureReturnType
                      (this->parseContext,&sampler,&txType,&(this->super_HlslTokenStream).token.loc)
    ;
    if (bVar1) {
      TType::TType(&local_c0,&sampler,EvqUniform,(TArraySizes *)0x0);
      TType::shallowCopy(type,&local_c0);
      iVar3 = (*type->_vptr_TType[10])(type);
      *(undefined1 *)(CONCAT44(extraout_var,iVar3) + 0x2c) = 0;
    }
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptSamplerTypeDX9(TType &type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    TSamplerDim dim = EsdNone;
    TType txType(EbtFloat, EvqUniform, 4); // default type is float4

    bool isShadow = false;

    switch (samplerType)
    {
    case EHTokSampler:		dim = Esd2D;	break;
    case EHTokSampler1d:	dim = Esd1D;	break;
    case EHTokSampler2d:	dim = Esd2D;	break;
    case EHTokSampler3d:	dim = Esd3D;	break;
    case EHTokSamplerCube:	dim = EsdCube;	break;
    default:
        return false; // not a dx9 sampler declaration
    }

    advanceToken(); // consume the sampler type keyword

    TArraySizes *arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.set(txType.getBasicType(), dim, false, isShadow, false);

    if (!parseContext.setTextureReturnType(sampler, txType, token.loc))
        return false;

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));
    type.getQualifier().layoutFormat = ElfNone;

    return true;
}